

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O3

const_iterator __thiscall
frozen::unordered_map<frozen::basic_string<char>,int,3ul,frozen::elsa<void>,eq>::
find<std::__cxx11::string>
          (unordered_map<frozen::basic_string<char>,int,3ul,frozen::elsa<void>,eq> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  const_iterator this_00;
  const_iterator pvVar1;
  size_t sVar2;
  const_iterator pvVar3;
  size_t sVar4;
  
  this_00 = (const_iterator)(this + 0x48);
  sVar2 = bits::pmh_tables<8ul,frozen::elsa<void>>::lookup<std::__cxx11::string,frozen::elsa<void>>
                    ((pmh_tables<8ul,frozen::elsa<void>> *)this_00,key,(elsa<void> *)this_00);
  pvVar3 = this_00;
  if (sVar2 != 3) {
    pvVar1 = (const_iterator)(this + sVar2 * 0x18);
    sVar2 = key->_M_string_length;
    if (((pvVar1->first).size_ == sVar2) && (pvVar3 = pvVar1, sVar2 != 0)) {
      sVar4 = 0;
      do {
        if ((pvVar1->first).data_[sVar4] != (key->_M_dataplus)._M_p[sVar4]) {
          return this_00;
        }
        sVar4 = sVar4 + 1;
      } while (sVar2 != sVar4);
    }
  }
  return pvVar3;
}

Assistant:

constexpr const_iterator find(KeyType const &key) const {
    return find_impl(*this, key, hash_function(), key_eq());
  }